

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_local_datetime<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  failure<toml::error_info> *__return_storage_ptr___00;
  char cVar1;
  bool bVar2;
  local_date lVar3;
  undefined4 uVar4;
  element_type *peVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar10;
  error_type *this;
  value_type *pvVar11;
  error_type *this_00;
  value_type *pvVar12;
  ulong uVar13;
  error_info *v;
  error_info *v_00;
  undefined8 v_01;
  size_t sVar14;
  basic_value<toml::type_config> *v_02;
  region *this_01;
  size_t sVar15;
  ulong uVar16;
  local_datetime val;
  result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
  time_fmt_reg;
  location first;
  source_location src;
  result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
  date_fmt_reg;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined1 local_5c8 [16];
  pointer local_5b8;
  string local_5a8;
  string local_588;
  undefined1 local_568 [16];
  _Alloc_hider local_558;
  size_type local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  size_t local_538;
  size_t sStack_530;
  size_t sStack_528;
  size_t sStack_520;
  size_t local_518;
  size_t sStack_510;
  size_t local_508;
  region local_500;
  undefined1 local_498 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_478;
  undefined8 local_460;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450 [4];
  location local_408;
  undefined1 local_3c0 [104];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_358;
  size_t local_348;
  size_t sStack_340;
  size_t local_338;
  size_t sStack_330;
  size_t local_328;
  size_t sStack_320;
  size_t local_318;
  undefined1 local_310 [16];
  pointer local_300;
  source_location local_2f8;
  undefined1 local_278 [120];
  basic_value<toml::type_config> local_200;
  failure<toml::error_info> local_138;
  undefined1 local_e0 [176];
  undefined2 uVar8;
  undefined2 uVar9;
  
  location::location(&local_408,loc);
  parse_local_date_only<toml::type_config>
            ((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
              *)local_278,loc,ctx);
  if (local_278[0] == false) {
    this = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
           ::unwrap_err((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                         *)local_278,(source_location)0x4d0308);
    err<toml::error_info&>((failure<toml::error_info> *)local_e0,(toml *)this,v);
    __return_storage_ptr__->is_ok_ = false;
    this_01 = (region *)local_e0;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
               (failure<toml::error_info> *)this_01);
  }
  else {
    peVar5 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar13 = loc->location_;
    lVar6 = (long)(peVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar10 = (long)(peVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - lVar6;
    if (uVar10 <= uVar13) {
LAB_0036f397:
      region::region((region *)local_498,loc);
      source_location::source_location((source_location *)local_3c0,(region *)local_498);
      region::~region((region *)local_498);
      local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_588,
                 "toml::parse_local_datetime: expect date-time delimiter `T`, `t` or ` `(space).",""
                );
      local_2f8.file_name_._M_dataplus._M_p = (pointer)&local_2f8.file_name_.field_2;
      local_2f8.last_offset_._0_4_ = local_3c0._48_4_;
      local_2f8.last_offset_._4_4_ = local_3c0._52_4_;
      local_2f8.length_._0_4_ = local_3c0._56_4_;
      local_2f8.length_._4_4_ = local_3c0._60_4_;
      local_2f8.last_line_ = local_3c0._32_8_;
      local_2f8.last_column_ = local_3c0._40_8_;
      local_2f8.first_offset_ = local_3c0._24_8_;
      local_2f8.first_line_ = local_3c0._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._64_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_3c0 + 0x50)) {
        local_2f8.file_name_.field_2._8_8_ = local_3c0._88_8_;
      }
      else {
        local_2f8.file_name_._M_dataplus._M_p = (pointer)local_3c0._64_8_;
      }
      local_2f8.file_name_._M_string_length = local_3c0._72_8_;
      local_3c0._72_8_ = (element_type *)0x0;
      local_3c0._80_8_ = local_3c0._80_8_ & 0xffffffffffffff00;
      local_2f8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3c0._96_8_;
      local_2f8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)aStack_358._M_allocated_capacity;
      local_2f8.line_str_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aStack_358._8_8_;
      stack0xfffffffffffffca0 = (undefined1  [16])0x0;
      aStack_358._8_8_ = (pointer)0x0;
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
      local_3c0._64_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_3c0 + 0x50);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a8,"here","");
      make_error_info<>((error_info *)local_498,&local_588,&local_2f8,&local_5a8);
      __return_storage_ptr___00 = (failure<toml::error_info> *)(local_e0 + 0x58);
      err<toml::error_info>(__return_storage_ptr___00,(error_info *)local_498);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,
                 __return_storage_ptr___00);
      failure<toml::error_info>::~failure(__return_storage_ptr___00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460 != local_450) {
        operator_delete((void *)local_460,local_450[0]._M_allocated_capacity + 1);
      }
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_478);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_498._1_7_,local_498[0]) != &local_488) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_498._1_7_,local_498[0]),
                        (ulong)(local_488._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location(&local_2f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != &local_588.field_2) {
        operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)local_3c0);
      goto LAB_0036fa4b;
    }
    cVar1 = *(char *)(lVar6 + uVar13);
    if (cVar1 == ' ') {
      uVar16 = 2;
      if (uVar13 + 1 < uVar10) {
LAB_0036f60f:
        uVar10 = uVar13 + 1;
        loc->column_number_ = loc->column_number_ + 1;
      }
      else {
        sVar14 = loc->line_number_;
        sVar15 = loc->column_number_;
        do {
          if (*(char *)(lVar6 + uVar13) == '\n') {
            sVar14 = sVar14 + 1;
            loc->line_number_ = sVar14;
            sVar15 = 1;
          }
          else {
            sVar15 = sVar15 + 1;
          }
          loc->column_number_ = sVar15;
          uVar13 = uVar13 + 1;
        } while (uVar10 != uVar13);
        uVar16 = 2;
      }
    }
    else if (cVar1 == 't') {
      uVar16 = 1;
      if (uVar13 + 1 < uVar10) goto LAB_0036f60f;
      sVar14 = loc->line_number_;
      sVar15 = loc->column_number_;
      do {
        if (*(char *)(lVar6 + uVar13) == '\n') {
          sVar14 = sVar14 + 1;
          loc->line_number_ = sVar14;
          sVar15 = 1;
        }
        else {
          sVar15 = sVar15 + 1;
        }
        loc->column_number_ = sVar15;
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
      uVar16 = 1;
    }
    else {
      if (cVar1 != 'T') goto LAB_0036f397;
      if (uVar13 + 1 < uVar10) {
        uVar16 = 0;
        goto LAB_0036f60f;
      }
      sVar14 = loc->line_number_;
      sVar15 = loc->column_number_;
      uVar16 = 0;
      do {
        if (*(char *)(lVar6 + uVar13) == '\n') {
          sVar14 = sVar14 + 1;
          loc->line_number_ = sVar14;
          sVar15 = 1;
        }
        else {
          sVar15 = sVar15 + 1;
        }
        loc->column_number_ = sVar15;
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
    }
    loc->location_ = uVar10;
    parse_local_time_only<toml::type_config>
              ((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                *)local_498,loc,ctx);
    if (local_498[0] == false) {
      this_00 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap_err((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                              *)local_498,(source_location)0x4d0320);
      err<toml::error_info&>(&local_138,(toml *)this_00,v_00);
      __return_storage_ptr__->is_ok_ = false;
      failure<toml::error_info>::failure
                ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_138);
      failure<toml::error_info>::~failure(&local_138);
    }
    else {
      pvVar11 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                          *)local_498,(source_location)0x4d0338);
      bVar2 = (pvVar11->
              super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
              ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
              super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.has_seconds;
      pvVar11 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                          *)local_498,(source_location)0x4d0350);
      local_3c0._32_8_ =
           (pvVar11->
           super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
           ).super__Tuple_impl<1UL,_toml::local_time_format_info,_toml::detail::region>.
           super__Head_base<1UL,_toml::local_time_format_info,_false>._M_head_impl.
           subsecond_precision;
      local_568._0_8_ =
           local_408.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_568._8_8_ =
           local_408.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_408.source_.
          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_408.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_408.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_408.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_408.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_558._M_p = (pointer)&local_548;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_558,local_408.source_name_._M_dataplus._M_p,
                 local_408.source_name_._M_dataplus._M_p + local_408.source_name_._M_string_length);
      sStack_530 = local_408.location_;
      sStack_528 = local_408.line_number_;
      sStack_520 = local_408.column_number_;
      local_518 = loc->location_;
      sStack_510 = loc->line_number_;
      local_538 = local_518 - local_408.location_;
      local_508 = loc->column_number_;
      pvVar12 = result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap((result<std::tuple<toml::local_date,_toml::local_date_format_info,_toml::detail::region>,_toml::error_info>
                          *)local_278,(source_location)0x4d0368);
      lVar3 = (pvVar12->
              super__Tuple_impl<0UL,_toml::local_date,_toml::local_date_format_info,_toml::detail::region>
              ).super__Head_base<0UL,_toml::local_date,_false>._M_head_impl;
      pvVar11 = result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                ::unwrap((result<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>,_toml::error_info>
                          *)local_498,(source_location)0x4d0380);
      local_3c0._96_8_ = local_550;
      local_3c0._80_8_ = local_568._8_8_;
      local_3c0._72_8_ = local_568._0_8_;
      local_3c0._24_8_ = (ulong)bVar2 << 8 | uVar16;
      uVar7._0_1_ = (pvVar11->
                    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                    ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.hour;
      uVar7._1_1_ = (pvVar11->
                    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                    ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.minute;
      uVar7._2_1_ = (pvVar11->
                    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                    ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.second;
      uVar7._3_1_ = (pvVar11->
                    super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                    ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.field_0x3;
      uVar8 = (pvVar11->
              super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
              ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.millisecond;
      uVar9 = (pvVar11->
              super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
              ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.microsecond;
      uVar7._4_4_ = CONCAT22(uVar9,uVar8);
      uVar4 = *(undefined4 *)
               &(pvVar11->
                super__Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
                ).super__Head_base<0UL,_toml::local_time,_false>._M_head_impl.nanosecond;
      uStack_5d4 = (undefined4)uVar7;
      local_3c0._20_2_ = (undefined2)uVar4;
      local_3c0._8_8_ = CONCAT44(uStack_5d4,lVar3);
      local_568._0_8_ = (element_type *)0x0;
      local_568._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_500.source_name_._M_dataplus._M_p = (pointer)&local_500.source_name_.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_p == &local_548) {
        local_500.source_name_.field_2._8_8_ = local_548._8_8_;
        local_558._M_p = local_500.source_name_._M_dataplus._M_p;
      }
      local_500.source_name_.field_2._M_allocated_capacity._1_7_ =
           local_548._M_allocated_capacity._1_7_;
      local_500.source_name_.field_2._M_local_buf[0] = local_548._M_local_buf[0];
      local_550 = 0;
      local_548._M_local_buf[0] = '\0';
      local_500.length_ = local_538;
      local_500.first_ = sStack_530;
      local_500.first_line_ = sStack_528;
      local_500.first_column_ = sStack_520;
      local_500.last_ = local_518;
      local_500.last_line_ = sStack_510;
      local_500.last_column_ = local_508;
      local_3c0[0] = (toml)0x6;
      local_3c0._16_4_ = uVar7._4_4_;
      local_500.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_500.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      v_01 = local_500.source_name_.field_2._M_allocated_capacity;
      local_3c0._88_8_ = local_558._M_p;
      if (local_558._M_p == local_500.source_name_._M_dataplus._M_p) {
        aStack_358._8_8_ = local_500.source_name_.field_2._8_8_;
        v_01 = (basic_value<toml::type_config> *)CONCAT44(uVar4,uVar7._4_4_);
        local_3c0._88_8_ = &aStack_358;
      }
      aStack_358._M_allocated_capacity = local_500.source_name_.field_2._M_allocated_capacity;
      local_500.source_name_._M_string_length = 0;
      local_500.source_name_.field_2._M_allocated_capacity =
           (ulong)(uint7)local_548._M_allocated_capacity._1_7_ << 8;
      local_348 = local_538;
      sStack_340 = sStack_530;
      local_338 = sStack_528;
      sStack_330 = sStack_520;
      local_328 = local_518;
      sStack_320 = sStack_510;
      local_318 = local_508;
      local_310 = (undefined1  [16])0x0;
      local_300 = (pointer)0x0;
      local_5c8 = (undefined1  [16])0x0;
      local_5b8 = (pointer)0x0;
      local_558._M_p = (pointer)&local_548;
      ok<toml::basic_value<toml::type_config>>
                ((success<toml::basic_value<toml::type_config>_> *)&local_200,(toml *)local_3c0,
                 (basic_value<toml::type_config> *)v_01);
      __return_storage_ptr__->is_ok_ = true;
      v_02 = &local_200;
      basic_value<toml::type_config>::basic_value
                (&(__return_storage_ptr__->field_1).succ_.value,v_02);
      basic_value<toml::type_config>::cleanup(&local_200,(EVP_PKEY_CTX *)v_02);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_200.comments_);
      region::~region(&local_200.region_);
      basic_value<toml::type_config>::cleanup
                ((basic_value<toml::type_config> *)local_3c0,(EVP_PKEY_CTX *)v_02);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_310);
      region::~region((region *)(local_3c0 + 0x48));
      region::~region(&local_500);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5c8);
      region::~region((region *)local_568);
    }
    this_01 = (region *)(local_498 + 8);
    if (local_498[0] == true) {
      region::~region(this_01);
      goto LAB_0036fa4b;
    }
  }
  failure<toml::error_info>::~failure((failure<toml::error_info> *)this_01);
LAB_0036fa4b:
  if (local_278[0] == true) {
    region::~region((region *)(local_278 + 8));
  }
  else {
    failure<toml::error_info>::~failure((failure<toml::error_info> *)(local_278 + 8));
  }
  location::~location(&local_408);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_local_datetime(location& loc, const context<TC>& ctx)
{
    using char_type = location::char_type;

    const auto first = loc;

    local_datetime_format_info fmt;

    // ----------------------------------------------------------------------

    auto date_fmt_reg = parse_local_date_only(loc, ctx);
    if(date_fmt_reg.is_err())
    {
        return err(date_fmt_reg.unwrap_err());
    }

    if(loc.current() == char_type('T'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::upper_T;
    }
    else if(loc.current() == char_type('t'))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::lower_t;
    }
    else if(loc.current() == char_type(' '))
    {
        loc.advance();
        fmt.delimiter = datetime_delimiter_kind::space;
    }
    else
    {
        auto src = source_location(region(loc));
        return err(make_error_info("toml::parse_local_datetime: "
            "expect date-time delimiter `T`, `t` or ` `(space).",
            std::move(src), "here"));
    }

    auto time_fmt_reg = parse_local_time_only(loc, ctx);
    if(time_fmt_reg.is_err())
    {
        return err(time_fmt_reg.unwrap_err());
    }

    fmt.has_seconds         = std::get<1>(time_fmt_reg.unwrap()).has_seconds;
    fmt.subsecond_precision = std::get<1>(time_fmt_reg.unwrap()).subsecond_precision;

    // ----------------------------------------------------------------------

    region reg(first, loc);
    local_datetime val(std::get<0>(date_fmt_reg.unwrap()),
                       std::get<0>(time_fmt_reg.unwrap()));

    return ok(basic_value<TC>(val, std::move(fmt), {}, std::move(reg)));
}